

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

void __thiscall YAML::EmitterState::SetLocalValue(EmitterState *this,EMITTER_MANIP value)

{
  EMITTER_MANIP in_ESI;
  EmitterState *in_RDI;
  EMITTER_MANIP unaff_retaddr;
  value unaff_retaddr_00;
  undefined4 in_stack_00000008;
  value in_stack_fffffffffffffff0;
  
  SetOutputCharset(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetStringFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetBoolFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetBoolCaseFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetBoolLengthFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetNullFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetIntFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  SetFlowType((EmitterState *)CONCAT44(value,in_stack_00000008),unaff_retaddr_00,unaff_retaddr,
              (value)((ulong)in_RDI >> 0x20));
  SetFlowType((EmitterState *)CONCAT44(value,in_stack_00000008),unaff_retaddr_00,unaff_retaddr,
              (value)((ulong)in_RDI >> 0x20));
  SetMapKeyFormat(in_RDI,in_ESI,in_stack_fffffffffffffff0);
  return;
}

Assistant:

void EmitterState::SetLocalValue(EMITTER_MANIP value) {
  SetOutputCharset(value, FmtScope::Local);
  SetStringFormat(value, FmtScope::Local);
  SetBoolFormat(value, FmtScope::Local);
  SetBoolCaseFormat(value, FmtScope::Local);
  SetBoolLengthFormat(value, FmtScope::Local);
  SetNullFormat(value, FmtScope::Local);
  SetIntFormat(value, FmtScope::Local);
  SetFlowType(GroupType::Seq, value, FmtScope::Local);
  SetFlowType(GroupType::Map, value, FmtScope::Local);
  SetMapKeyFormat(value, FmtScope::Local);
}